

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_deletable_handle_graph.cpp
# Opt level: O3

handle_t __thiscall
handlegraph::MutablePathDeletableHandleGraph::change_sequence
          (MutablePathDeletableHandleGraph *this,handle_t *handle,string *sequence)

{
  long lVar1;
  long lVar2;
  handle_t *phVar3;
  char acVar4 [8];
  char cVar5;
  char acVar6 [8];
  handle_t hVar7;
  char acVar8 [8];
  undefined1 auVar9 [16];
  handle_t new_handle;
  vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_> steps;
  char local_a8 [8];
  handle_t *local_a0;
  char local_98 [8];
  char (*pacStack_90) [8];
  char (*local_88) [8];
  char (*local_78) [8];
  undefined8 local_70;
  code *local_68;
  code *local_60;
  char local_58 [8];
  char acStack_50 [8];
  undefined1 *local_48;
  undefined1 local_40 [16];
  
  local_a8 = (char  [8])
             (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x1d0)) + 0xa0))
                       (&this->field_0x0 + *(long *)(*(long *)this + -0x1d0),sequence);
  lVar1 = *(long *)(*(long *)this + -0xb0);
  local_a0 = handle;
  local_98 = (char  [8])HandleGraph::forward((HandleGraph *)(&this->field_0x0 + lVar1),handle);
  local_70 = 0;
  local_60 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_78 = &local_58;
  local_58 = (char  [8])this;
  acStack_50 = (char  [8])local_a8;
  (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x90))
            ((HandleGraph *)(&this->field_0x0 + lVar1),local_98,0);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  phVar3 = local_a0;
  lVar1 = *(long *)(*(long *)this + -0xb0);
  local_98 = (char  [8])HandleGraph::forward((HandleGraph *)(&this->field_0x0 + lVar1),local_a0);
  acStack_50 = (char  [8])phVar3;
  local_70 = 0;
  local_60 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_78 = &local_58;
  local_58 = (char  [8])this;
  local_48 = local_a8;
  (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x90))
            ((HandleGraph *)(&this->field_0x0 + lVar1),local_98,1);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  local_48 = (undefined1 *)0x0;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  acStack_50[0] = '\0';
  acStack_50[1] = '\0';
  acStack_50[2] = '\0';
  acStack_50[3] = '\0';
  acStack_50[4] = '\0';
  acStack_50[5] = '\0';
  acStack_50[6] = '\0';
  acStack_50[7] = '\0';
  local_70 = 0;
  local_60 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_98 = (char  [8])local_58;
  local_78 = &local_98;
  (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0x130))
            (&this->field_0x0 + *(long *)(*(long *)this + -0x168),local_a0);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  acVar4 = acStack_50;
  if (local_58 != acStack_50) {
    acVar8 = local_58;
    do {
      lVar1 = *(long *)(*(long *)this + -0xb0);
      lVar2 = *(long *)(*(long *)this + -0x168);
      local_78 = (char (*) [8])
                 (**(code **)(*(long *)(&this->field_0x0 + lVar2) + 0xd8))
                           (&this->field_0x0 + lVar2,acVar8);
      cVar5 = (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x28))
                        (&this->field_0x0 + lVar1,&local_78);
      acVar6 = local_a8;
      if (cVar5 != '\0') {
        acVar6 = (char  [8])
                 (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xb0)) + 0x30)
                 )(&this->field_0x0 + *(long *)(*(long *)this + -0xb0),local_a8);
      }
      local_98[0] = '\0';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      pacStack_90 = (char (*) [8])0x0;
      local_88 = (char (*) [8])0x0;
      local_98 = (char  [8])operator_new(8);
      pacStack_90 = (char (*) [8])((long)local_98 + 8);
      *(char (*) [8])local_98 = acVar6;
      lVar1 = *(long *)(*(long *)this + -0x1c8);
      lVar2 = *(long *)(*(long *)this + -0x168);
      local_88 = pacStack_90;
      auVar9 = (**(code **)(*(long *)(&this->field_0x0 + lVar2) + 0x118))
                         (&this->field_0x0 + lVar2,acVar8);
      local_40 = auVar9;
      (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x188))
                (&local_78,&this->field_0x0 + lVar1,acVar8,local_40,local_98);
      if (local_98 != (char  [8])0x0) {
        operator_delete((void *)local_98,(long)local_88 - (long)local_98);
      }
      acVar8 = (char  [8])((long)acVar8 + 0x10);
    } while (acVar8 != acVar4);
  }
  cVar5 = (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xb0)) + 0x28))
                    (&this->field_0x0 + *(long *)(*(long *)this + -0xb0),local_a0);
  if (cVar5 != '\0') {
    local_a8 = (char  [8])
               (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xb0)) + 0x30))
                         (&this->field_0x0 + *(long *)(*(long *)this + -0xb0),local_a8);
  }
  (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x1e0)) + 0xf8))
            (&this->field_0x0 + *(long *)(*(long *)this + -0x1e0),local_a0);
  if (local_58 != (char  [8])0x0) {
    operator_delete((void *)local_58,(long)local_48 - (long)local_58);
  }
  hVar7.data[0] = local_a8[0];
  hVar7.data[1] = local_a8[1];
  hVar7.data[2] = local_a8[2];
  hVar7.data[3] = local_a8[3];
  hVar7.data[4] = local_a8[4];
  hVar7.data[5] = local_a8[5];
  hVar7.data[6] = local_a8[6];
  hVar7.data[7] = local_a8[7];
  return (handle_t)hVar7.data;
}

Assistant:

handle_t MutablePathDeletableHandleGraph::change_sequence(const handle_t& handle,
                                                          const std::string& sequence) {
    // TODO: repetitive with DeletableHandleGraph, but we can't call it because it could destroy
    // all the paths containing the handle as a side effect of the destroy_handle call at the end
    
    // new handle with the new sequence
    handle_t new_handle = create_handle(sequence);
    // copy its edges
    follow_edges(forward(handle), false, [&](const handle_t& next) {
        create_edge(new_handle, next);
    });
    follow_edges(forward(handle), true, [&](const handle_t& prev) {
        // ensure that we don't double add a non-reversing self-edge
        if (get_id(prev) != get_id(handle) || get_is_reverse(prev)) {
            create_edge(prev, new_handle);
        }
    });
    
    // collect the steps we need to replace
    std::vector<step_handle_t> steps;
    for_each_step_on_handle(handle, [&](const step_handle_t& step) {
        steps.push_back(step);
    });
    
    // replace them
    for (const auto& step : steps) {
        std::vector<handle_t> rewriter(1, get_is_reverse(get_handle_of_step(step)) ? flip(new_handle) : new_handle);
        rewrite_segment(step, get_next_step(step), rewriter);
    }
    if (get_is_reverse(handle)) {
        new_handle = flip(new_handle);
    }
    
    // clear the original
    destroy_handle(handle);
    
    return new_handle;
}